

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::UnknownFieldSetTest_ClearAndFreeMemory_Test::
~UnknownFieldSetTest_ClearAndFreeMemory_Test(UnknownFieldSetTest_ClearAndFreeMemory_Test *this)

{
  UnknownFieldSetTest_ClearAndFreeMemory_Test *this_local;
  
  ~UnknownFieldSetTest_ClearAndFreeMemory_Test(this);
  operator_delete(this,0x398);
  return;
}

Assistant:

TEST_F(UnknownFieldSetTest, ClearAndFreeMemory) {
  EXPECT_GT(unknown_fields_->field_count(), 0);
  unknown_fields_->ClearAndFreeMemory();
  EXPECT_EQ(0, unknown_fields_->field_count());
  unknown_fields_->AddVarint(123456, 654321);
  EXPECT_EQ(1, unknown_fields_->field_count());
}